

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O0

void test_locked_semaphore_getting_unlocked(void)

{
  thread thread;
  LockstepScheduler ls;
  pthread_mutex_t lock;
  pthread_cond_t cond;
  thread *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff98;
  LockstepScheduler *in_stack_ffffffffffffffa0;
  pthread_mutex_t local_58;
  pthread_cond_t local_30;
  
  pthread_cond_init(&local_30,(pthread_condattr_t *)0x0);
  pthread_mutex_init(&local_58,(pthread_mutexattr_t *)0x0);
  LockstepScheduler::LockstepScheduler((LockstepScheduler *)&stack0xffffffffffffff58);
  LockstepScheduler::set_absolute_time(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pthread_mutex_lock(&local_58);
  std::thread::thread<test_locked_semaphore_getting_unlocked()::__0,,void>
            (in_stack_ffffffffffffff40,(type *)&local_58.__data);
  pthread_mutex_lock(&local_58);
  pthread_cond_broadcast(&local_30);
  pthread_mutex_unlock(&local_58);
  std::thread::join();
  pthread_mutex_destroy(&local_58);
  pthread_cond_destroy(&local_30);
  std::thread::~thread((thread *)0x10f6ea);
  LockstepScheduler::~LockstepScheduler((LockstepScheduler *)0x10f6f4);
  return;
}

Assistant:

void test_locked_semaphore_getting_unlocked()
{
    // Create locked condition.
    pthread_cond_t cond;
    pthread_cond_init(&cond, NULL);

    // And a lock which needs to be locked
    pthread_mutex_t lock;
    pthread_mutex_init(&lock, NULL);

    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);

    pthread_mutex_lock(&lock);
    // Use a thread to wait for condition while we already have the lock.
    // This ensures the synchronization happens in the right order.
    std::thread thread([&ls, &cond, &lock]() {

        ls.set_absolute_time(some_time_us + 500);
        assert(ls.cond_timedwait(&cond, &lock, some_time_us + 1000) == 0);
        // It should be re-locked afterwards, so we should be able to unlock it.
        assert(pthread_mutex_unlock(&lock) == 0);
    });

    pthread_mutex_lock(&lock);
    pthread_cond_broadcast(&cond);
    pthread_mutex_unlock(&lock);

    thread.join();

    pthread_mutex_destroy(&lock);
    pthread_cond_destroy(&cond);
}